

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void EmitDebugLineInternal
               (raw_ostream *RealOS,Data *DI,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *computedLengths)

{
  bool bVar1;
  reference pLVar2;
  reference puVar3;
  reference pSVar4;
  char *pcVar5;
  void *__buf;
  reference pFVar6;
  reference pLVar7;
  const_reference pvVar8;
  reference pHVar9;
  uint8_t *puVar10;
  pointer *this;
  reference pHVar11;
  uint64_t *puVar12;
  string *Str;
  uint uVar13;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  ulong local_218;
  size_t Size;
  Hex64 OpData;
  iterator __end6;
  iterator __begin6;
  vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_> *__range6;
  iterator iStack_1e8;
  Hex8 OpByte;
  iterator __end5;
  iterator __begin5;
  vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_> *__range5;
  LineTableOpcode Op;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
  *__range2_3;
  File File;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_> *__range2_2;
  StringRef IncludeDir;
  __normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
  local_e0;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range2_1;
  const_iterator cStack_c0;
  uchar OpcodeLength;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  uint64_t SizeOfPrologueLength;
  undefined1 local_90 [8];
  raw_string_ostream OS;
  string Buffer;
  LineTable *LineTable;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *computedLengths_local;
  Data *DI_local;
  raw_ostream *RealOS_local;
  uint64_t uVar14;
  
  __end1 = std::vector<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>::
           begin(&DI->DebugLines);
  LineTable = (LineTable *)
              std::vector<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>::
              end(&DI->DebugLines);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_llvm::DWARFYAML::LineTable_*,_std::vector<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>_>
                                *)&LineTable);
    if (!bVar1) {
      return;
    }
    pLVar2 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFYAML::LineTable_*,_std::vector<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)&OS.OS);
    llvm::raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_90,(string *)&OS.OS);
    bVar1 = llvm::DWARFYAML::InitialLength::isDWARF64(&pLVar2->Length);
    writeInteger<unsigned_short>
              (pLVar2->Version,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
    uVar13 = DI->IsLittleEndian & 1;
    uVar14 = (uint64_t)uVar13;
    writeVariableSizedInteger
              (pLVar2->PrologueLength,(ulong)bVar1 * 4 + 4,(raw_ostream *)local_90,SUB41(uVar13,0));
    writeInteger<unsigned_char>
              (pLVar2->MinInstLength,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
    if (3 < pLVar2->Version) {
      writeInteger<unsigned_char>
                (pLVar2->MaxOpsPerInst,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
    }
    writeInteger<unsigned_char>
              (pLVar2->DefaultIsStmt,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
    writeInteger<unsigned_char>
              (pLVar2->LineBase,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
    writeInteger<unsigned_char>
              (pLVar2->LineRange,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
    writeInteger<unsigned_char>
              (pLVar2->OpcodeBase,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
    __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                       (&pLVar2->StandardOpcodeLengths);
    cStack_c0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (&pLVar2->StandardOpcodeLengths);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff40), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end2);
      writeInteger<unsigned_char>(*puVar3,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                         (&pLVar2->IncludeDirs);
    local_e0._M_current =
         (StringRef *)
         std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end(&pLVar2->IncludeDirs);
    while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&local_e0), bVar1) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
               ::operator*(&__end2_1);
      __range2_2 = (vector<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_> *)
                   pSVar4->Data;
      IncludeDir.Data = (char *)pSVar4->Length;
      pcVar5 = llvm::StringRef::data((StringRef *)&__range2_2);
      __buf = (void *)llvm::StringRef::size((StringRef *)&__range2_2);
      llvm::raw_ostream::write((raw_ostream *)local_90,(int)pcVar5,__buf,uVar14);
      llvm::raw_ostream::write((raw_ostream *)local_90,0,__buf_01,uVar14);
      __gnu_cxx::
      __normal_iterator<const_llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
      ::operator++(&__end2_1);
    }
    llvm::raw_ostream::write((raw_ostream *)local_90,0,__buf_00,uVar14);
    __end2_2 = std::vector<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>::begin
                         (&pLVar2->Files);
    File.Length = (uint64_t)
                  std::vector<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>::end
                            (&pLVar2->Files);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_llvm::DWARFYAML::File_*,_std::vector<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>_>
                               *)&File.Length), bVar1) {
      pFVar6 = __gnu_cxx::
               __normal_iterator<const_llvm::DWARFYAML::File_*,_std::vector<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>_>
               ::operator*(&__end2_2);
      uVar14 = pFVar6->Length;
      __range2_3 = (vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
                    *)(pFVar6->Name).Data;
      File.Name.Data = (char *)(pFVar6->Name).Length;
      File.Name.Length = pFVar6->DirIdx;
      File.DirIdx = pFVar6->ModTime;
      File.ModTime = uVar14;
      EmitFileEntry((raw_ostream *)local_90,(File *)&__range2_3);
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFYAML::File_*,_std::vector<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>_>
      ::operator++(&__end2_2);
    }
    llvm::raw_ostream::write((raw_ostream *)local_90,0,__buf_02,uVar14);
    __end2_3 = std::
               vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
               ::begin(&pLVar2->Opcodes);
    Op.StandardOpcodeData.super__Vector_base<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
                  ::end(&pLVar2->Opcodes);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<const_llvm::DWARFYAML::LineTableOpcode_*,_std::vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>_>
                               *)&Op.StandardOpcodeData.
                                  super__Vector_base<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
      pLVar7 = __gnu_cxx::
               __normal_iterator<const_llvm::DWARFYAML::LineTableOpcode_*,_std::vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>_>
               ::operator*(&__end2_3);
      llvm::DWARFYAML::LineTableOpcode::LineTableOpcode((LineTableOpcode *)&__range5,pLVar7);
      writeInteger<unsigned_char>
                ((byte)__range5,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
      if ((byte)__range5 == 0) {
        llvm::encodeULEB128(Op._0_8_,(raw_ostream *)local_90,0);
        writeInteger<unsigned_char>
                  ((uchar)Op.ExtLen,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
        switch((undefined4)Op.ExtLen) {
        case 1:
          break;
        case 2:
        case 4:
          uVar14 = CONCAT62(Op._18_6_,(undefined2)Op.SubOpcode);
          pvVar8 = std::vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>::
                   operator[](&DI->CompileUnits,0);
          writeVariableSizedInteger
                    (uVar14,(ulong)pvVar8->AddrSize,(raw_ostream *)local_90,
                     (bool)(DI->IsLittleEndian & 1));
          break;
        case 3:
          EmitFileEntry((raw_ostream *)local_90,(File *)&Op.SData);
          break;
        default:
          puVar12 = &Op.FileEntry.Length;
          __end5 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::begin
                             ((vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_> *)puVar12
                             );
          iStack_1e8 = std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::end
                                 ((vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_> *)
                                  puVar12);
          while (bVar1 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffe18), bVar1) {
            pHVar9 = __gnu_cxx::
                     __normal_iterator<llvm::yaml::Hex8_*,_std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>_>
                     ::operator*(&__end5);
            __range6._7_1_ = pHVar9->value;
            puVar10 = llvm::yaml::Hex8::operator_cast_to_unsigned_char_
                                ((Hex8 *)((long)&__range6 + 7));
            writeInteger<unsigned_char>
                      (*puVar10,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1));
            __gnu_cxx::
            __normal_iterator<llvm::yaml::Hex8_*,_std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>_>
            ::operator++(&__end5);
          }
        }
      }
      else if ((byte)__range5 < pLVar2->OpcodeBase) {
        switch((byte)__range5) {
        case 1:
        case 6:
        case 7:
        case 8:
        case 10:
        case 0xb:
          break;
        case 2:
        case 4:
        case 5:
        case 0xc:
          llvm::encodeULEB128(CONCAT62(Op._18_6_,(undefined2)Op.SubOpcode),(raw_ostream *)local_90,0
                             );
          break;
        case 3:
          llvm::encodeSLEB128(Op.Data,(raw_ostream *)local_90,0);
          break;
        case 9:
          writeInteger<unsigned_short>
                    ((undefined2)Op.SubOpcode,(raw_ostream *)local_90,(bool)(DI->IsLittleEndian & 1)
                    );
          break;
        default:
          this = &Op.UnknownOpcodeData.
                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
          __end6 = std::vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>::begin
                             ((vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_> *)this)
          ;
          OpData.value = (uint64_t)
                         std::vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>::end
                                   ((vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_> *
                                    )this);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<llvm::yaml::Hex64_*,_std::vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>_>
                                             *)&OpData), bVar1) {
            pHVar11 = __gnu_cxx::
                      __normal_iterator<llvm::yaml::Hex64_*,_std::vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>_>
                      ::operator*(&__end6);
            Size = pHVar11->value;
            puVar12 = llvm::yaml::Hex64::operator_cast_to_unsigned_long_((Hex64 *)&Size);
            llvm::encodeULEB128(*puVar12,(raw_ostream *)local_90,0);
            __gnu_cxx::
            __normal_iterator<llvm::yaml::Hex64_*,_std::vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>_>
            ::operator++(&__end6);
          }
        }
      }
      llvm::DWARFYAML::LineTableOpcode::~LineTableOpcode((LineTableOpcode *)&__range5);
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFYAML::LineTableOpcode_*,_std::vector<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>_>
      ::operator++(&__end2_3);
    }
    llvm::raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_90);
    local_218 = std::__cxx11::string::size();
    if (0xfffffffe < local_218) break;
    if (computedLengths != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (computedLengths,&local_218);
    }
    writeInteger<unsigned_int>((uint)local_218,RealOS,(bool)(DI->IsLittleEndian & 1));
    Str = llvm::raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_90);
    llvm::raw_ostream::operator<<(RealOS,Str);
    llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_90);
    std::__cxx11::string::~string((string *)&OS.OS);
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFYAML::LineTable_*,_std::vector<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>_>
    ::operator++(&__end1);
  }
  llvm::llvm_unreachable_internal
            ("Table is too big",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFEmitter.cpp"
             ,0x166);
}

Assistant:

static void EmitDebugLineInternal(raw_ostream &RealOS,
                                  const DWARFYAML::Data &DI,
                                  std::vector<size_t>* computedLengths) {
  for (auto &LineTable : DI.DebugLines) {
    // XXX BINARYEN We need to update each line table's length. Write to a
    // temp stream first, then get the size from that.
    std::string Buffer;
    raw_string_ostream OS(Buffer);

    // XXX BINARYEN writeInitialLength(LineTable.Length, OS, DI.IsLittleEndian);

    uint64_t SizeOfPrologueLength = LineTable.Length.isDWARF64() ? 8 : 4;
    writeInteger((uint16_t)LineTable.Version, OS, DI.IsLittleEndian);
    writeVariableSizedInteger(LineTable.PrologueLength, SizeOfPrologueLength,
                              OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.MinInstLength, OS, DI.IsLittleEndian);
    if (LineTable.Version >= 4)
      writeInteger((uint8_t)LineTable.MaxOpsPerInst, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.DefaultIsStmt, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.LineBase, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.LineRange, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.OpcodeBase, OS, DI.IsLittleEndian);

    for (auto OpcodeLength : LineTable.StandardOpcodeLengths)
      writeInteger((uint8_t)OpcodeLength, OS, DI.IsLittleEndian);

    for (auto IncludeDir : LineTable.IncludeDirs) {
      OS.write(IncludeDir.data(), IncludeDir.size());
      OS.write('\0');
    }
    OS.write('\0');

    for (auto File : LineTable.Files)
      EmitFileEntry(OS, File);
    OS.write('\0');

    for (auto Op : LineTable.Opcodes) {
      writeInteger((uint8_t)Op.Opcode, OS, DI.IsLittleEndian);
      if (Op.Opcode == 0) {
        encodeULEB128(Op.ExtLen, OS);
        writeInteger((uint8_t)Op.SubOpcode, OS, DI.IsLittleEndian);
        switch (Op.SubOpcode) {
        case dwarf::DW_LNE_set_address:
        case dwarf::DW_LNE_set_discriminator:
          writeVariableSizedInteger(Op.Data, DI.CompileUnits[0].AddrSize, OS,
                                    DI.IsLittleEndian);
          break;
        case dwarf::DW_LNE_define_file:
          EmitFileEntry(OS, Op.FileEntry);
          break;
        case dwarf::DW_LNE_end_sequence:
          break;
        default:
          for (auto OpByte : Op.UnknownOpcodeData)
            writeInteger((uint8_t)OpByte, OS, DI.IsLittleEndian);
        }
      } else if (Op.Opcode < LineTable.OpcodeBase) {
        switch (Op.Opcode) {
        case dwarf::DW_LNS_copy:
        case dwarf::DW_LNS_negate_stmt:
        case dwarf::DW_LNS_set_basic_block:
        case dwarf::DW_LNS_const_add_pc:
        case dwarf::DW_LNS_set_prologue_end:
        case dwarf::DW_LNS_set_epilogue_begin:
          break;

        case dwarf::DW_LNS_advance_pc:
        case dwarf::DW_LNS_set_file:
        case dwarf::DW_LNS_set_column:
        case dwarf::DW_LNS_set_isa:
          encodeULEB128(Op.Data, OS);
          break;

        case dwarf::DW_LNS_advance_line:
          encodeSLEB128(Op.SData, OS);
          break;

        case dwarf::DW_LNS_fixed_advance_pc:
          writeInteger((uint16_t)Op.Data, OS, DI.IsLittleEndian);
          break;

        default:
          for (auto OpData : Op.StandardOpcodeData) {
            encodeULEB128(OpData, OS);
          }
        }
      }
    }
    // XXX BINARYEN Write to the actual stream, with the proper size.
    // We assume for now that the length fits in 32 bits.
    size_t Size = OS.str().size();
    if (Size >= UINT32_MAX) {
      llvm_unreachable("Table is too big");
    }
    if (computedLengths) {
      computedLengths->push_back(Size);
    }
    writeInteger((uint32_t)Size, RealOS, DI.IsLittleEndian);
    RealOS << OS.str();
  }
}